

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureFilteringTests.cpp
# Opt level: O1

int __thiscall
deqp::gles2::Functional::Texture2DFilteringCase::init
          (Texture2DFilteringCase *this,EVP_PKEY_CTX *ctx)

{
  vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_> *this_00;
  float fVar1;
  uint uVar2;
  int i;
  int iVar3;
  int extraout_EAX;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Texture2D *pTVar4;
  long lVar5;
  uint uVar6;
  int iVar7;
  int levelNdx;
  long lVar8;
  pointer ppTVar9;
  uint uVar10;
  ulong uVar11;
  float fVar12;
  Vec4 gMax;
  Vector<float,_4> res_3;
  Vec4 gMin;
  Vec4 cScale;
  Vector<float,_4> res_7;
  Vec4 cBias;
  TextureFormatInfo fmtInfo;
  Vector<float,_4> res_6;
  Vec4 local_128;
  float local_114;
  float local_110;
  float local_10c;
  float local_108;
  float local_104;
  uint local_100;
  uint local_fc;
  undefined8 local_f8;
  undefined8 uStack_f0;
  Vec4 local_e8;
  float local_d8 [4];
  undefined1 *local_c8;
  float afStack_c0 [2];
  Texture2D *local_b8;
  vector<deqp::gles2::Functional::Texture2DFilteringCase::FilterCase,_std::allocator<deqp::gles2::Functional::Texture2DFilteringCase::FilterCase>_>
  *local_a0;
  TextureFormatInfo local_98;
  float local_58 [6];
  RGBA local_40 [4];
  
  this_00 = &this->m_textures;
  if ((this->m_filenames).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->m_filenames).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>::reserve(this_00,2);
    iVar7 = 1;
    do {
      pTVar4 = (Texture2D *)operator_new(0x70);
      glu::Texture2D::Texture2D
                (pTVar4,this->m_renderCtx,this->m_format,this->m_dataType,this->m_width,
                 this->m_height);
      local_98.valueMin.m_data._0_8_ = pTVar4;
      std::vector<glu::Texture2D*,std::allocator<glu::Texture2D*>>::emplace_back<glu::Texture2D*>
                ((vector<glu::Texture2D*,std::allocator<glu::Texture2D*>> *)this_00,
                 (Texture2D **)&local_98);
      iVar7 = iVar7 + -1;
    } while (iVar7 == 0);
    uVar10 = this->m_width;
    uVar6 = 1;
    if (((uVar10 & uVar10 - 1) == 0) && (uVar2 = this->m_height, (uVar2 & uVar2 - 1) == 0)) {
      if ((int)uVar2 < (int)uVar10) {
        uVar2 = uVar10;
      }
      uVar6 = 0x20;
      if (uVar2 != 0) {
        uVar6 = 0x1f;
        if (uVar2 != 0) {
          for (; uVar2 >> uVar6 == 0; uVar6 = uVar6 - 1) {
          }
        }
        uVar6 = uVar6 ^ 0x1f;
      }
      uVar6 = 0x20 - uVar6;
    }
    tcu::getTextureFormatInfo
              (&local_98,
               (TextureFormat *)
               &(*(this_00->super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>)
                  ._M_impl.super__Vector_impl_data._M_start)->m_refTexture);
    local_b8 = (Texture2D *)local_98.valueMin.m_data._0_8_;
    local_d8[0] = 0.0;
    local_d8[1] = 0.0;
    local_d8[2] = 0.0;
    local_d8[3] = 0.0;
    lVar8 = 0;
    do {
      local_d8[lVar8] = local_98.valueMax.m_data[lVar8] - local_98.valueMin.m_data[lVar8];
      lVar8 = lVar8 + 1;
    } while (lVar8 != 4);
    if (uVar6 != 0) {
      uVar11 = 0;
      do {
        local_f8 = 0xbf000000bf000000;
        uStack_f0 = 0x40000000bf000000;
        local_128.m_data[0] = 0.0;
        local_128.m_data[1] = 0.0;
        local_128.m_data[2] = 0.0;
        local_128.m_data[3] = 0.0;
        lVar8 = 0;
        do {
          local_128.m_data[lVar8] = *(float *)((long)&local_f8 + lVar8 * 4) * local_d8[lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar8 != 4);
        local_e8.m_data[0] = 0.0;
        local_e8.m_data[1] = 0.0;
        local_e8.m_data[2] = 0.0;
        local_e8.m_data[3] = 0.0;
        lVar8 = 0;
        do {
          local_e8.m_data[lVar8] = local_128.m_data[lVar8] + *(float *)((long)&local_b8 + lVar8 * 4)
          ;
          lVar8 = lVar8 + 1;
        } while (lVar8 != 4);
        local_c8 = &DAT_3f8000003f800000;
        afStack_c0[0] = 1.0;
        afStack_c0[1] = 0.0;
        local_f8 = 0;
        uStack_f0 = 0;
        lVar8 = 0;
        do {
          *(float *)((long)&local_f8 + lVar8 * 4) =
               *(float *)((long)&local_c8 + lVar8 * 4) * local_d8[lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar8 != 4);
        local_128.m_data[0] = 0.0;
        local_128.m_data[1] = 0.0;
        local_128.m_data[2] = 0.0;
        local_128.m_data[3] = 0.0;
        lVar8 = 0;
        do {
          local_128.m_data[lVar8] =
               *(float *)((long)&local_f8 + lVar8 * 4) + *(float *)((long)&local_b8 + lVar8 * 4);
          lVar8 = lVar8 + 1;
        } while (lVar8 != 4);
        tcu::Texture2D::allocLevel
                  (&(*(this_00->
                      super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>).
                      _M_impl.super__Vector_impl_data._M_start)->m_refTexture,(int)uVar11);
        tcu::fillWithComponentGradients
                  ((PixelBufferAccess *)
                   (uVar11 * 0x28 +
                   *(long *)&((*(this_00->
                                super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>
                                )._M_impl.super__Vector_impl_data._M_start)->m_refTexture).
                             super_TextureLevelPyramid.m_access.
                             super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                             ._M_impl),&local_e8,&local_128);
        uVar11 = uVar11 + 1;
      } while (uVar11 != uVar6);
      uVar11 = 0;
      do {
        tcu::Texture2D::allocLevel
                  (&(this_00->
                    super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>)._M_impl
                    .super__Vector_impl_data._M_start[1]->m_refTexture,(int)uVar11);
        uVar10 = (int)uVar11 * (0xffffff / uVar6);
        local_fc = uVar10 | 0xff000000;
        lVar8 = *(long *)&((this_00->
                           super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>).
                           _M_impl.super__Vector_impl_data._M_start[1]->m_refTexture).
                          super_TextureLevelPyramid.m_access.
                          super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                          ._M_impl;
        tcu::RGBA::toVec((RGBA *)&local_f8);
        local_100 = ~uVar10 | 0xff000000;
        local_128.m_data[0] = 0.0;
        local_128.m_data[1] = 0.0;
        local_128.m_data[2] = 0.0;
        local_128.m_data[3] = 0.0;
        lVar5 = 0;
        do {
          local_128.m_data[lVar5] = *(float *)((long)&local_f8 + lVar5 * 4) * local_d8[lVar5];
          lVar5 = lVar5 + 1;
        } while (lVar5 != 4);
        local_e8.m_data[0] = 0.0;
        local_e8.m_data[1] = 0.0;
        local_e8.m_data[2] = 0.0;
        local_e8.m_data[3] = 0.0;
        lVar5 = 0;
        do {
          local_e8.m_data[lVar5] = local_128.m_data[lVar5] + *(float *)((long)&local_b8 + lVar5 * 4)
          ;
          lVar5 = lVar5 + 1;
        } while (lVar5 != 4);
        tcu::RGBA::toVec(local_40);
        local_58[0] = 0.0;
        local_58[1] = 0.0;
        local_58[2] = 0.0;
        local_58[3] = 0.0;
        lVar5 = 0;
        do {
          local_58[lVar5] = (float)local_40[lVar5].m_value * local_d8[lVar5];
          lVar5 = lVar5 + 1;
        } while (lVar5 != 4);
        local_c8 = (undefined1 *)0x0;
        afStack_c0[0] = 0.0;
        afStack_c0[1] = 0.0;
        lVar5 = 0;
        do {
          *(float *)((long)&local_c8 + lVar5 * 4) =
               local_58[lVar5] + *(float *)((long)&local_b8 + lVar5 * 4);
          lVar5 = lVar5 + 1;
        } while (lVar5 != 4);
        tcu::fillWithGrid((PixelBufferAccess *)(uVar11 * 0x28 + lVar8),4,&local_e8,(Vec4 *)&local_c8
                         );
        uVar11 = uVar11 + 1;
      } while (uVar11 != uVar6);
    }
    for (ppTVar9 = (this->m_textures).
                   super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        ppTVar9 !=
        (this->m_textures).super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>.
        _M_impl.super__Vector_impl_data._M_finish; ppTVar9 = ppTVar9 + 1) {
      (*(*ppTVar9)->_vptr_Texture2D[2])();
    }
  }
  else {
    std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>::reserve(this_00,1);
    local_98.valueMin.m_data._0_8_ =
         glu::Texture2D::create
                   (this->m_renderCtx,this->m_renderCtxInfo,
                    ((this->super_TestCase).super_TestNode.m_testCtx)->m_curArchive,
                    (int)((ulong)((long)(this->m_filenames).
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(this->m_filenames).
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 5),
                    &this->m_filenames);
    std::vector<glu::Texture2D*,std::allocator<glu::Texture2D*>>::emplace_back<glu::Texture2D*>
              ((vector<glu::Texture2D*,std::allocator<glu::Texture2D*>> *)this_00,
               (Texture2D **)&local_98);
  }
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar7 = *(int *)CONCAT44(extraout_var,iVar3);
  if (0x3f < *(int *)CONCAT44(extraout_var,iVar3)) {
    iVar7 = 0x40;
  }
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  local_110 = (float)iVar7;
  iVar7 = *(int *)(CONCAT44(extraout_var_00,iVar3) + 4);
  iVar3 = 0x40;
  if (iVar7 < 0x40) {
    iVar3 = iVar7;
  }
  local_114 = (float)iVar3;
  local_a0 = &this->m_cases;
  lVar8 = 0x10;
  do {
    iVar7 = *(int *)((long)&UINT_01c0db60 + lVar8);
    ppTVar9 = (this->m_textures).
              super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    iVar3 = (int)((ulong)((long)(this->m_textures).
                                super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar9) >> 3) +
            -1;
    if (iVar7 < iVar3) {
      iVar3 = iVar7;
    }
    if (iVar7 < 0) {
      iVar3 = 0;
    }
    fVar1 = *(float *)(&UNK_01c0db6c + lVar8);
    local_104 = *(float *)((long)&DAT_01c0db70 + lVar8);
    local_108 = expf(*(float *)((long)&UINT_01c0db64 + lVar8) * 0.6931472);
    pTVar4 = ppTVar9[iVar3];
    local_10c = (float)(pTVar4->m_refTexture).m_width;
    fVar12 = expf(*(float *)(&UNK_01c0db68 + lVar8) * 0.6931472);
    local_98.valueMin.m_data._0_8_ = ppTVar9[iVar3];
    local_98.valueMin.m_data[3] = local_104;
    local_98.valueMax.m_data[1] =
         (fVar12 * local_114) / (float)(pTVar4->m_refTexture).m_height + local_104;
    local_98.valueMax.m_data[0] = (local_108 * local_110) / local_10c + fVar1;
    local_98.valueMin.m_data[2] = fVar1;
    std::
    vector<deqp::gles2::Functional::Texture2DFilteringCase::FilterCase,_std::allocator<deqp::gles2::Functional::Texture2DFilteringCase::FilterCase>_>
    ::emplace_back<deqp::gles2::Functional::Texture2DFilteringCase::FilterCase>
              (local_a0,(FilterCase *)&local_98);
    lVar8 = lVar8 + 0x14;
  } while (lVar8 != 0x60);
  this->m_caseNdx = 0;
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,"Pass");
  return extraout_EAX;
}

Assistant:

void Texture2DFilteringCase::init (void)
{
	try
	{
		if (!m_filenames.empty())
		{
			m_textures.reserve(1);
			m_textures.push_back(glu::Texture2D::create(m_renderCtx, m_renderCtxInfo, m_testCtx.getArchive(), (int)m_filenames.size(), m_filenames));
		}
		else
		{
			// Create 2 textures.
			m_textures.reserve(2);
			for (int ndx = 0; ndx < 2; ndx++)
				m_textures.push_back(new glu::Texture2D(m_renderCtx, m_format, m_dataType, m_width, m_height));

			bool					mipmaps		= deIsPowerOfTwo32(m_width) && deIsPowerOfTwo32(m_height);
			int						numLevels	= mipmaps ? deLog2Floor32(de::max(m_width, m_height))+1 : 1;
			tcu::TextureFormatInfo	fmtInfo		= tcu::getTextureFormatInfo(m_textures[0]->getRefTexture().getFormat());
			tcu::Vec4				cBias		= fmtInfo.valueMin;
			tcu::Vec4				cScale		= fmtInfo.valueMax-fmtInfo.valueMin;

			// Fill first gradient texture.
			for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
			{
				tcu::Vec4 gMin = tcu::Vec4(-0.5f, -0.5f, -0.5f, 2.0f)*cScale + cBias;
				tcu::Vec4 gMax = tcu::Vec4( 1.0f,  1.0f,  1.0f, 0.0f)*cScale + cBias;

				m_textures[0]->getRefTexture().allocLevel(levelNdx);
				tcu::fillWithComponentGradients(m_textures[0]->getRefTexture().getLevel(levelNdx), gMin, gMax);
			}

			// Fill second with grid texture.
			for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
			{
				deUint32	step	= 0x00ffffff / numLevels;
				deUint32	rgb		= step*levelNdx;
				deUint32	colorA	= 0xff000000 | rgb;
				deUint32	colorB	= 0xff000000 | ~rgb;

				m_textures[1]->getRefTexture().allocLevel(levelNdx);
				tcu::fillWithGrid(m_textures[1]->getRefTexture().getLevel(levelNdx), 4, tcu::RGBA(colorA).toVec()*cScale + cBias, tcu::RGBA(colorB).toVec()*cScale + cBias);
			}

			// Upload.
			for (std::vector<glu::Texture2D*>::iterator i = m_textures.begin(); i != m_textures.end(); i++)
				(*i)->upload();
		}

		// Compute cases.
		{
			const struct
			{
				int		texNdx;
				float	lodX;
				float	lodY;
				float	oX;
				float	oY;
			} cases[] =
			{
				{ 0,	1.6f,	2.9f,	-1.0f,	-2.7f	},
				{ 0,	-2.0f,	-1.35f,	-0.2f,	0.7f	},
				{ 1,	0.14f,	0.275f,	-1.5f,	-1.1f	},
				{ 1,	-0.92f,	-2.64f,	0.4f,	-0.1f	},
			};

			const float	viewportW	= (float)de::min<int>(VIEWPORT_WIDTH, m_renderCtx.getRenderTarget().getWidth());
			const float	viewportH	= (float)de::min<int>(VIEWPORT_HEIGHT, m_renderCtx.getRenderTarget().getHeight());

			for (int caseNdx = 0; caseNdx < DE_LENGTH_OF_ARRAY(cases); caseNdx++)
			{
				const int	texNdx	= de::clamp(cases[caseNdx].texNdx, 0, (int)m_textures.size()-1);
				const float	lodX	= cases[caseNdx].lodX;
				const float	lodY	= cases[caseNdx].lodY;
				const float	oX		= cases[caseNdx].oX;
				const float	oY		= cases[caseNdx].oY;
				const float	sX		= deFloatExp2(lodX)*viewportW / float(m_textures[texNdx]->getRefTexture().getWidth());
				const float	sY		= deFloatExp2(lodY)*viewportH / float(m_textures[texNdx]->getRefTexture().getHeight());

				m_cases.push_back(FilterCase(m_textures[texNdx], tcu::Vec2(oX, oY), tcu::Vec2(oX+sX, oY+sY)));
			}
		}

		m_caseNdx = 0;
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	catch (...)
	{
		// Clean up to save memory.
		Texture2DFilteringCase::deinit();
		throw;
	}
}